

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_eigensolver_sac.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  element_type *peVar1;
  ostream *poVar2;
  void *pvVar3;
  size_type sVar4;
  reference pvVar5;
  translations_t *in_RSI;
  undefined4 in_EDI;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  timeval tVar9;
  translation_t *unaff_retaddr;
  rotation_t *in_stack_00000008;
  translation_t *in_stack_00000010;
  size_t in_stack_00000020;
  bearingVectors_t *in_stack_00000028;
  bearingVectors_t *in_stack_00000030;
  vector<int,_std::allocator<int>_> *in_stack_00000038;
  vector<int,_std::allocator<int>_> *in_stack_00000040;
  MatrixXd *in_stack_00000048;
  size_t i;
  model_t optimizedModel;
  double ransac_time;
  timeval toc;
  timeval tic;
  shared_ptr<opengv::sac_problems::relative_pose::EigensolverSacProblem> eigenproblem_ptr;
  Ransac<opengv::sac_problems::relative_pose::EigensolverSacProblem> ransac;
  CentralRelativeAdapter adapter;
  rotation_t rotation;
  translation_t position;
  MatrixXd gt;
  vector<int,_std::allocator<int>_> camCorrespondences2;
  vector<int,_std::allocator<int>_> camCorrespondences1;
  bearingVectors_t bearingVectors2;
  bearingVectors_t bearingVectors1;
  rotations_t camRotations;
  translations_t camOffsets;
  rotation_t rotation2;
  translation_t position2;
  rotation_t rotation1;
  translation_t position1;
  size_t numberPoints;
  double outlierFraction;
  double noise;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_fffffffffffffa28;
  undefined4 uVar10;
  EigensolverSacProblem *__p;
  Matrix<double,_3,_3,_0,_3,_3> *in_stack_fffffffffffffa30;
  EigensolverOutput *this;
  rotation_t *rotation_00;
  unsigned_long *in_stack_fffffffffffffa40;
  CentralRelativeAdapter *this_00;
  int *in_stack_fffffffffffffa48;
  undefined1 randomSeed;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_fffffffffffffa50;
  undefined1 *sampleSize;
  adapter_t *in_stack_fffffffffffffa58;
  EigensolverSacProblem *in_stack_fffffffffffffa60;
  rotations_t *in_stack_fffffffffffffaa8;
  translations_t *in_stack_fffffffffffffab0;
  undefined1 normalize;
  rotation_t *in_stack_fffffffffffffab8;
  translation_t *in_stack_fffffffffffffac0;
  rotation_t *in_stack_fffffffffffffac8;
  rotation_t *in_stack_fffffffffffffad0;
  translation_t *in_stack_fffffffffffffad8;
  translation_t *in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb0c;
  ulong local_4d8;
  undefined1 local_4d0 [116];
  int in_stack_fffffffffffffba4;
  Ransac<opengv::sac_problems::relative_pose::EigensolverSacProblem> *in_stack_fffffffffffffba8;
  timeval local_3e8;
  timeval local_3d8 [2];
  undefined4 local_3b0;
  int local_3ac;
  undefined8 local_3a8;
  undefined1 local_398 [16];
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffffc78;
  ostream *in_stack_fffffffffffffc80;
  vector<int,_std::allocator<int>_> local_2c0 [10];
  undefined4 local_1bc;
  undefined1 local_1b8 [24];
  undefined1 local_1a0 [24];
  undefined1 local_188 [48];
  EigensolverOutput local_158;
  double dVar11;
  double noise_00;
  rotations_t *camRotations_00;
  int iVar12;
  
  iVar12 = 0;
  opengv::initializeRandomSeed();
  camRotations_00 = (rotations_t *)0x3fe0000000000000;
  noise_00 = 0.1;
  dVar11 = 4.94065645841247e-322;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffa30,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffa28);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            (in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
  opengv::generateRandomDirectionTranslation
            ((double)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
  opengv::generateRandomRotation((double)camRotations_00);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)0xb8bed1);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            *)0xb8bede);
  opengv::generateCentralCameraSystem(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  normalize = (undefined1)((ulong)in_stack_fffffffffffffab0 >> 0x38);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)0xb8bf04);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)0xb8bf13);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0xb8bf22);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0xb8bf2f);
  local_1bc = 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_long>
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
  sampleSize = local_1b8;
  randomSeed = (undefined1)((ulong)local_1a0 >> 0x38);
  this_00 = (CentralRelativeAdapter *)local_188;
  rotation_00 = (rotation_t *)(local_188 + 0x18);
  this = &local_158;
  opengv::generateRandom2D2DCorrespondences
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,(rotation_t *)CONCAT44(iVar12,in_EDI)
             ,in_RSI,camRotations_00,in_stack_00000020,noise_00,dVar11,in_stack_00000028,
             in_stack_00000030,in_stack_00000038,in_stack_00000040,in_stack_00000048);
  uVar10 = (undefined4)((ulong)dVar11 >> 0x20);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0xb8bff9);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0xb8c008);
  __p = (EigensolverSacProblem *)CONCAT44(uVar10,1);
  opengv::extractRelativePose
            (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
             in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
             (bool)normalize);
  opengv::printExperimentCharacteristics
            ((translation_t *)this_00,rotation_00,(double)this,(double)__p);
  opengv::relative_pose::CentralRelativeAdapter::CentralRelativeAdapter
            (this_00,(bearingVectors_t *)rotation_00,(bearingVectors_t *)this,(rotation_t *)__p);
  uVar6 = 0;
  opengv::sac::Ransac<opengv::sac_problems::relative_pose::EigensolverSacProblem>::Ransac
            ((Ransac<opengv::sac_problems::relative_pose::EigensolverSacProblem> *)this_00,
             (int)((ulong)rotation_00 >> 0x20),(double)this,(double)__p);
  operator_new(0x13f0);
  opengv::sac_problems::relative_pose::EigensolverSacProblem::EigensolverSacProblem
            (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,(size_t)sampleSize,(bool)randomSeed
            );
  std::shared_ptr<opengv::sac_problems::relative_pose::EigensolverSacProblem>::
  shared_ptr<opengv::sac_problems::relative_pose::EigensolverSacProblem,void>
            ((shared_ptr<opengv::sac_problems::relative_pose::EigensolverSacProblem> *)this,__p);
  std::shared_ptr<opengv::sac_problems::relative_pose::EigensolverSacProblem>::operator=
            ((shared_ptr<opengv::sac_problems::relative_pose::EigensolverSacProblem> *)this,
             (shared_ptr<opengv::sac_problems::relative_pose::EigensolverSacProblem> *)__p);
  local_3a8 = 0x3ff0000000000000;
  local_3b0 = 100;
  gettimeofday(local_3d8,(__timezone_ptr_t)0x0);
  opengv::sac::Ransac<opengv::sac_problems::relative_pose::EigensolverSacProblem>::computeModel
            (in_stack_fffffffffffffba8,in_stack_fffffffffffffba4);
  gettimeofday(&local_3e8,(__timezone_ptr_t)0x0);
  tVar9 = timeval_minus((timeval *)&local_3e8,(timeval *)local_3d8);
  dVar11 = (double)tVar9.tv_sec;
  tVar9 = timeval_minus((timeval *)&local_3e8,(timeval *)local_3d8);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar11;
  auVar7._0_8_ = (double)tVar9.tv_usec;
  auVar7._8_8_ = uVar6;
  auVar7 = vfmadd213sd_fma(ZEXT816(0x3eb0c6f7a0b5ed8d),auVar7,auVar8);
  opengv::EigensolverOutput::EigensolverOutput(this);
  peVar1 = std::
           __shared_ptr_access<opengv::sac_problems::relative_pose::EigensolverSacProblem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<opengv::sac_problems::relative_pose::EigensolverSacProblem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0xb8c269);
  (*(peVar1->super_SampleConsensusProblem<opengv::EigensolverOutput>)._vptr_SampleConsensusProblem
    [6])(peVar1,local_2c0,local_398,local_4d0);
  poVar2 = std::operator<<((ostream *)&std::cout,"the ransac results is: ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = Eigen::operator<<(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Ransac needed ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_3ac);
  std::operator<<(poVar2," iterations and ");
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,auVar7._0_8_);
  poVar2 = std::operator<<(poVar2," seconds");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"the number of inliers is: ");
  sVar4 = std::vector<int,_std::allocator<int>_>::size(local_2c0);
  std::ostream::operator<<(poVar2,sVar4);
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"the found inliers are: ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_4d8 = 0;
  while( true ) {
    sVar4 = std::vector<int,_std::allocator<int>_>::size(local_2c0);
    if (sVar4 <= local_4d8) break;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_2c0,local_4d8);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,*pvVar5);
    std::operator<<(poVar2," ");
    local_4d8 = local_4d8 + 1;
  }
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"the optimized result is: ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = Eigen::operator<<(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::shared_ptr<opengv::sac_problems::relative_pose::EigensolverSacProblem>::~shared_ptr
            ((shared_ptr<opengv::sac_problems::relative_pose::EigensolverSacProblem> *)0xb8c680);
  opengv::sac::Ransac<opengv::sac_problems::relative_pose::EigensolverSacProblem>::~Ransac
            ((Ransac<opengv::sac_problems::relative_pose::EigensolverSacProblem> *)0xb8c68d);
  opengv::relative_pose::CentralRelativeAdapter::~CentralRelativeAdapter
            ((CentralRelativeAdapter *)0xb8c69a);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xb8c6a7);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)this_00);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)this_00);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             *)this_00);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)this_00);
  return iVar12;
}

Assistant:

int main( int argc, char** argv )
{
  // initialize random seed
  initializeRandomSeed();

  //set experiment parameters
  double noise = 0.5;
  double outlierFraction = 0.1;
  size_t numberPoints = 100;

  //generate a random pose for viewpoint 1
  translation_t position1 = Eigen::Vector3d::Zero();
  rotation_t rotation1 = Eigen::Matrix3d::Identity();

  //generate a random pose for viewpoint 2
  translation_t position2 = generateRandomDirectionTranslation(0.1);
  rotation_t rotation2 = generateRandomRotation(0.5);

  //create a fake central camera
  translations_t camOffsets;
  rotations_t camRotations;
  generateCentralCameraSystem( camOffsets, camRotations );

  //derive correspondences based on random point-cloud
  bearingVectors_t bearingVectors1;
  bearingVectors_t bearingVectors2;
  std::vector<int> camCorrespondences1; //unused in the central case
  std::vector<int> camCorrespondences2; //unused in the central case
  Eigen::MatrixXd gt(3,numberPoints);
  generateRandom2D2DCorrespondences(
      position1, rotation1, position2, rotation2,
      camOffsets, camRotations, numberPoints, noise, outlierFraction,
      bearingVectors1, bearingVectors2,
      camCorrespondences1, camCorrespondences2, gt );

  //Extract the relative pose
  translation_t position; rotation_t rotation;
  extractRelativePose(
      position1, position2, rotation1, rotation2, position, rotation );

  //print experiment characteristics
  printExperimentCharacteristics( position, rotation, noise, outlierFraction );

  //create a central relative adapter
  relative_pose::CentralRelativeAdapter adapter(
      bearingVectors1,
      bearingVectors2,
      rotation);

  //Create an EigensolverSacProblem and Ransac
  //The number of samples can be configured
  sac::Ransac<
      sac_problems::relative_pose::EigensolverSacProblem> ransac;
  std::shared_ptr<
      sac_problems::relative_pose::EigensolverSacProblem> eigenproblem_ptr(
      new sac_problems::relative_pose::EigensolverSacProblem(adapter,10));
  ransac.sac_model_ = eigenproblem_ptr;
  ransac.threshold_ = 1.0;
  ransac.max_iterations_ = 100;

  //Run the experiment
  struct timeval tic;
  struct timeval toc;
  gettimeofday( &tic, 0 );
  ransac.computeModel();
  gettimeofday( &toc, 0 );
  double ransac_time = TIMETODOUBLE(timeval_minus(toc,tic));

  //do final polishing of the model over all inliers
  sac_problems::relative_pose::EigensolverSacProblem::model_t optimizedModel;
  eigenproblem_ptr->optimizeModelCoefficients(
      ransac.inliers_,
      ransac.model_coefficients_,
      optimizedModel);

  //print the results
  std::cout << "the ransac results is: " << std::endl;
  std::cout << ransac.model_coefficients_.rotation << std::endl << std::endl;
  std::cout << "Ransac needed " << ransac.iterations_ << " iterations and ";
  std::cout << ransac_time << " seconds" << std::endl << std::endl;
  std::cout << "the number of inliers is: " << ransac.inliers_.size();
  std::cout << std::endl << std::endl;
  std::cout << "the found inliers are: " << std::endl;
  for(size_t i = 0; i < ransac.inliers_.size(); i++)
    std::cout << ransac.inliers_[i] << " ";
  std::cout << std::endl << std::endl;
  std::cout << "the optimized result is: " << std::endl;
  std::cout << optimizedModel.rotation << std::endl;
}